

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64_stage8_sse4_1
               (__m128i *u,__m128i *cospim32,__m128i *cospi32,__m128i *cospim16,__m128i *cospi48,
               __m128i *cospi16,__m128i *cospim48,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rnding,int bit)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *out0;
  __m128i *in_R9;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  undefined8 extraout_XMM0_Qb_17;
  undefined8 extraout_XMM0_Qb_18;
  __m128i in0;
  __m128i in0_00;
  __m128i temp4;
  __m128i temp3;
  __m128i temp2;
  __m128i temp1;
  int i;
  __m128i *in_stack_ffffffffffffff88;
  undefined8 uVar1;
  __m128i *in_stack_ffffffffffffff90;
  undefined8 uVar2;
  undefined4 local_34;
  
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0xa0),in_RDX,(__m128i *)(in_RDI + 0xd0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0xa0),in_RDX,(__m128i *)(in_RDI + 0xd0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0xd0) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0xd8) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0xa0) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0xa8) = extraout_XMM0_Qb;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0xb0),in_RDX,(__m128i *)(in_RDI + 0xc0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  out1 = (__m128i *)(ulong)(uint)temp2[1];
  out0 = (__m128i *)temp2[0];
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0xb0),in_RDX,(__m128i *)(in_RDI + 0xc0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0xc0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 200) = extraout_XMM0_Qb_02;
  *(undefined8 *)(in_RDI + 0xb0) = extraout_XMM0_Qa_01;
  *(undefined8 *)(in_RDI + 0xb8) = extraout_XMM0_Qb_01;
  for (local_34 = 0x10; (int)local_34 < 0x14; local_34 = local_34 + 1) {
    in0[0] = in_RDI + (long)(int)local_34 * 0x10;
    in0[1] = in_RDI + (long)(int)(local_34 ^ 7) * 0x10;
    addsub_sse4_1(in0,temp3,out0,out1,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    in0_00[0] = in_RDI + (long)(int)(local_34 ^ 0xf) * 0x10;
    in0_00[1] = in_RDI + (long)(int)(local_34 ^ 8) * 0x10;
    addsub_sse4_1(in0_00,temp3,out0,out1,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  }
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x240),in_R8,(__m128i *)(in_RDI + 0x3b0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x250),in_R8,(__m128i *)(in_RDI + 0x3a0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x260),in_R8,(__m128i *)(in_RDI + 0x390),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x270),in_R8,(__m128i *)(in_RDI + 0x380),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  uVar1 = extraout_XMM0_Qa_06;
  uVar2 = extraout_XMM0_Qb_06;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x270),in_R9,(__m128i *)(in_RDI + 0x380),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x380) = extraout_XMM0_Qa_07;
  *(undefined8 *)(in_RDI + 0x388) = extraout_XMM0_Qb_07;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x260),in_R9,(__m128i *)(in_RDI + 0x390),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x390) = extraout_XMM0_Qa_08;
  *(undefined8 *)(in_RDI + 0x398) = extraout_XMM0_Qb_08;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x250),in_R9,(__m128i *)(in_RDI + 0x3a0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x3a0) = extraout_XMM0_Qa_09;
  *(undefined8 *)(in_RDI + 0x3a8) = extraout_XMM0_Qb_09;
  half_btf_sse4_1(in_R8,(__m128i *)(in_RDI + 0x240),in_R9,(__m128i *)(in_RDI + 0x3b0),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x3b0) = extraout_XMM0_Qa_10;
  *(undefined8 *)(in_RDI + 0x3b8) = extraout_XMM0_Qb_10;
  *(undefined8 *)(in_RDI + 0x240) = extraout_XMM0_Qa_03;
  *(undefined8 *)(in_RDI + 0x248) = extraout_XMM0_Qb_03;
  *(undefined8 *)(in_RDI + 0x250) = extraout_XMM0_Qa_04;
  *(undefined8 *)(in_RDI + 600) = extraout_XMM0_Qb_04;
  *(undefined8 *)(in_RDI + 0x260) = extraout_XMM0_Qa_05;
  *(undefined8 *)(in_RDI + 0x268) = extraout_XMM0_Qb_05;
  *(undefined8 *)(in_RDI + 0x270) = uVar1;
  *(undefined8 *)(in_RDI + 0x278) = uVar2;
  half_btf_sse4_1((__m128i *)temp4[1],(__m128i *)(in_RDI + 0x280),in_RCX,(__m128i *)(in_RDI + 0x370)
                  ,(__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1((__m128i *)temp4[1],(__m128i *)(in_RDI + 0x290),in_RCX,(__m128i *)(in_RDI + 0x360)
                  ,(__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1((__m128i *)temp4[1],(__m128i *)(in_RDI + 0x2a0),in_RCX,(__m128i *)(in_RDI + 0x350)
                  ,(__m128i *)temp2[0],(uint)temp2[1]);
  half_btf_sse4_1((__m128i *)temp4[1],(__m128i *)(in_RDI + 0x2b0),in_RCX,(__m128i *)(in_RDI + 0x340)
                  ,(__m128i *)temp2[0],(uint)temp2[1]);
  uVar1 = extraout_XMM0_Qa_14;
  uVar2 = extraout_XMM0_Qb_14;
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x2b0),in_R8,(__m128i *)(in_RDI + 0x340),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x340) = extraout_XMM0_Qa_15;
  *(undefined8 *)(in_RDI + 0x348) = extraout_XMM0_Qb_15;
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x2a0),in_R8,(__m128i *)(in_RDI + 0x350),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x350) = extraout_XMM0_Qa_16;
  *(undefined8 *)(in_RDI + 0x358) = extraout_XMM0_Qb_16;
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x290),in_R8,(__m128i *)(in_RDI + 0x360),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x360) = extraout_XMM0_Qa_17;
  *(undefined8 *)(in_RDI + 0x368) = extraout_XMM0_Qb_17;
  half_btf_sse4_1(in_RCX,(__m128i *)(in_RDI + 0x280),in_R8,(__m128i *)(in_RDI + 0x370),
                  (__m128i *)temp2[0],(uint)temp2[1]);
  *(undefined8 *)(in_RDI + 0x370) = extraout_XMM0_Qa_18;
  *(undefined8 *)(in_RDI + 0x378) = extraout_XMM0_Qb_18;
  *(undefined8 *)(in_RDI + 0x280) = extraout_XMM0_Qa_11;
  *(undefined8 *)(in_RDI + 0x288) = extraout_XMM0_Qb_11;
  *(undefined8 *)(in_RDI + 0x290) = extraout_XMM0_Qa_12;
  *(undefined8 *)(in_RDI + 0x298) = extraout_XMM0_Qb_12;
  *(undefined8 *)(in_RDI + 0x2a0) = extraout_XMM0_Qa_13;
  *(undefined8 *)(in_RDI + 0x2a8) = extraout_XMM0_Qb_13;
  *(undefined8 *)(in_RDI + 0x2b0) = uVar1;
  *(undefined8 *)(in_RDI + 0x2b8) = uVar2;
  return;
}

Assistant:

static inline void idct64_stage8_sse4_1(
    __m128i *u, const __m128i *cospim32, const __m128i *cospi32,
    const __m128i *cospim16, const __m128i *cospi48, const __m128i *cospi16,
    const __m128i *cospim48, const __m128i *clamp_lo, const __m128i *clamp_hi,
    const __m128i *rnding, int bit) {
  int i;
  __m128i temp1, temp2, temp3, temp4;
  temp1 = half_btf_sse4_1(cospim32, &u[10], cospi32, &u[13], rnding, bit);
  u[13] = half_btf_sse4_1(cospi32, &u[10], cospi32, &u[13], rnding, bit);
  u[10] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &u[11], cospi32, &u[12], rnding, bit);
  u[12] = half_btf_sse4_1(cospi32, &u[11], cospi32, &u[12], rnding, bit);
  u[11] = temp2;

  for (i = 16; i < 20; ++i) {
    addsub_sse4_1(u[i], u[i ^ 7], &u[i], &u[i ^ 7], clamp_lo, clamp_hi);
    addsub_sse4_1(u[i ^ 15], u[i ^ 8], &u[i ^ 15], &u[i ^ 8], clamp_lo,
                  clamp_hi);
  }

  temp1 = half_btf_sse4_1(cospim16, &u[36], cospi48, &u[59], rnding, bit);
  temp2 = half_btf_sse4_1(cospim16, &u[37], cospi48, &u[58], rnding, bit);
  temp3 = half_btf_sse4_1(cospim16, &u[38], cospi48, &u[57], rnding, bit);
  temp4 = half_btf_sse4_1(cospim16, &u[39], cospi48, &u[56], rnding, bit);
  u[56] = half_btf_sse4_1(cospi48, &u[39], cospi16, &u[56], rnding, bit);
  u[57] = half_btf_sse4_1(cospi48, &u[38], cospi16, &u[57], rnding, bit);
  u[58] = half_btf_sse4_1(cospi48, &u[37], cospi16, &u[58], rnding, bit);
  u[59] = half_btf_sse4_1(cospi48, &u[36], cospi16, &u[59], rnding, bit);
  u[36] = temp1;
  u[37] = temp2;
  u[38] = temp3;
  u[39] = temp4;

  temp1 = half_btf_sse4_1(cospim48, &u[40], cospim16, &u[55], rnding, bit);
  temp2 = half_btf_sse4_1(cospim48, &u[41], cospim16, &u[54], rnding, bit);
  temp3 = half_btf_sse4_1(cospim48, &u[42], cospim16, &u[53], rnding, bit);
  temp4 = half_btf_sse4_1(cospim48, &u[43], cospim16, &u[52], rnding, bit);
  u[52] = half_btf_sse4_1(cospim16, &u[43], cospi48, &u[52], rnding, bit);
  u[53] = half_btf_sse4_1(cospim16, &u[42], cospi48, &u[53], rnding, bit);
  u[54] = half_btf_sse4_1(cospim16, &u[41], cospi48, &u[54], rnding, bit);
  u[55] = half_btf_sse4_1(cospim16, &u[40], cospi48, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;
}